

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_heap.c
# Opt level: O0

sexp sexp_callback_remap(sexp ctx,sexp s,void *user)

{
  sexp psVar1;
  undefined1 auVar2 [16];
  sexp_uint_t __n;
  long *in_RDX;
  sexp in_RSI;
  sexp in_RDI;
  size_t size;
  sexp_remap_state *state;
  sexp local_8;
  
  psVar1 = (((in_RDI->value).type.setters)->value).type.id;
  auVar2._8_8_ = (long)psVar1 >> 0x3f;
  auVar2._0_8_ = (ulong)psVar1 & 0xfffffffffffffffe;
  __n = sexp_gc_allocated_bytes
                  (in_RDI,(sexp_conflict *)
                          &((((in_RDI->value).type.setters)->value).port.stream)->_IO_read_end,
                   SUB168(auVar2 / SEXT816(2),0),in_RSI);
  if ((ulong)in_RDX[4] < (ulong)in_RDX[5]) {
    memcpy((void *)in_RDX[4],in_RSI,__n);
    *(sexp *)(in_RDX[10] + *in_RDX * 0x10) = in_RSI;
    *(long *)(in_RDX[10] + *in_RDX * 0x10 + 8) = in_RDX[4];
    if (in_RDI == in_RSI) {
      in_RDX[7] = in_RDX[4];
    }
    in_RDX[4] = in_RDX[4] + __n;
    *in_RDX = *in_RDX + 1;
    local_8 = (sexp)&DAT_0000013e;
  }
  else {
    snprintf(gc_heap_err_str,0x100,"callback_remap i=%zu p>end internal error",*in_RDX);
    local_8 = (sexp)&DAT_0000003e;
  }
  return local_8;
}

Assistant:

static sexp sexp_callback_remap(sexp ctx, sexp s, void *user) {
  struct sexp_remap_state* state = user;
  size_t size = sexp_gc_allocated_bytes(ctx, sexp_context_types(ctx),
                                        sexp_context_num_types(ctx), s);
  if (state->p >= state->end) {
    snprintf(gc_heap_err_str, ERR_STR_SIZE, "callback_remap i=%zu p>end internal error", state->index);
    return SEXP_FALSE; }
  memcpy(state->p, s, size);
  
  state->remap[state->index].srcp = s;
  state->remap[state->index].dstp = state->p;
  if (ctx == s) state->ctx_dst = state->p;
  
  state->p = (sexp)(((unsigned char*)state->p) + size);
  state->index += 1;

  return SEXP_TRUE;
}